

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions.hpp
# Opt level: O1

Boxed_Value __thiscall
chaiscript::dispatch::
Attribute_Access<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::AST_Node>
::do_call(Attribute_Access<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::AST_Node>
          *this,Function_Params *params,Type_Conversions_State *t_conversions)

{
  Type_Conversions *this_00;
  AST_Node *pAVar1;
  Boxed_Value *in_RCX;
  shared_ptr<chaiscript::Boxed_Value::Data> sVar2;
  Boxed_Value BVar3;
  
  this_00 = (t_conversions->m_conversions)._M_data;
  if ((*(byte *)((this_00->m_mutex)._M_impl._M_rwlock.__align + 0x10) & 1) == 0) {
    pAVar1 = boxed_cast<chaiscript::AST_Node*>((chaiscript *)this_00,in_RCX,t_conversions);
  }
  else {
    pAVar1 = boxed_cast<chaiscript::AST_Node_const*>((chaiscript *)this_00,in_RCX,t_conversions);
  }
  sVar2 = Boxed_Value::Object_Data::get<std::__cxx11::string_const>
                    ((Object_Data *)this,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (pAVar1 + (long)params[4].m_begin),true);
  BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount = sVar2.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
  BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Boxed_Value do_call(const Function_Params &params, const Type_Conversions_State &t_conversions) const override {
        const Boxed_Value &bv = params[0];
        if (bv.is_const()) {
          const Class *o = boxed_cast<const Class *>(bv, &t_conversions);
          return do_call_impl<T>(o);
        } else {
          Class *o = boxed_cast<Class *>(bv, &t_conversions);
          return do_call_impl<T>(o);
        }
      }